

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode * Cudd_bddComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *g;
  ulong uVar3;
  
  g = dd->one;
  piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  uVar3 = (ulong)(uint)n;
  while( true ) {
    if ((int)uVar3 < 1) {
      piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return g;
    }
    if ((phase == (int *)0x0) || (phase[uVar3 - 1] != 0)) {
      pDVar2 = vars[uVar3 - 1];
    }
    else {
      pDVar2 = (DdNode *)((ulong)vars[uVar3 - 1] ^ 1);
    }
    pDVar2 = Cudd_bddAnd(dd,pDVar2,g);
    if (pDVar2 == (DdNode *)0x0) break;
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,g);
    uVar3 = uVar3 - 1;
    g = pDVar2;
  }
  Cudd_RecursiveDeref(dd,g);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_bddAnd(dd,vars[i],cube);
        } else {
            fn = Cudd_bddAnd(dd,Cudd_Not(vars[i]),cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}